

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::utils::Hex_abi_cxx11_
          (string *__return_storage_ptr__,utils *this,ByteArray *aBytes)

{
  bool bVar1;
  char c1;
  char c0;
  const_iterator cStack_38;
  uchar byte;
  const_iterator __end2;
  const_iterator __begin2;
  ByteArray *__range2;
  ByteArray *aBytes_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  cStack_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*(&__end2);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Hex(const ByteArray &aBytes)
{
    std::string str;
    for (auto byte : aBytes)
    {
        char c0 = (byte & 0xF0) >> 4;
        char c1 = byte & 0x0F;
        str.push_back(c0 < 10 ? (c0 + '0') : (c0 + 'a' - 10));
        str.push_back(c1 < 10 ? (c1 + '0') : (c1 + 'a' - 10));
    }
    return str;
}